

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_module.cpp
# Opt level: O0

ModulePtr create_chaiscript_module_test_module(void)

{
  Type_Info ti;
  Type_Info ti_00;
  Type_Info ti_01;
  Type_Info ti_02;
  Type_Info ti_03;
  Module *this;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar2;
  allocator<char> local_9f1;
  string local_9f0;
  _func_void_shared_ptr<TestBaseType>_ptr *local_9d0;
  Proxy_Function local_9c8;
  allocator<char> local_9b1;
  string local_9b0;
  _func_void_shared_ptr<TestBaseType>_ptr *local_990;
  Proxy_Function local_988;
  allocator<char> local_971;
  string local_970;
  Proxy_Function local_950;
  Type_Conversion local_940;
  allocator<char> local_929;
  string local_928;
  code *local_908;
  undefined8 local_900;
  Proxy_Function local_8f8;
  allocator<char> local_8e1;
  string local_8e0;
  code *local_8c0;
  undefined8 local_8b8;
  Proxy_Function local_8b0;
  anon_class_1_0_00000001 local_899;
  Type_Conversion local_898;
  allocator<char> local_881;
  string local_880;
  code *local_860;
  undefined8 local_858;
  Proxy_Function local_850;
  allocator<char> local_839;
  string local_838;
  _func_int_TestEnum *local_818;
  Proxy_Function local_810;
  allocator<char> local_7f9;
  string local_7f8;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  allocator<char> local_7b9;
  string local_7b8;
  TestEnum local_794;
  Boxed_Value local_790;
  allocator<char> local_779;
  string local_778;
  _func_int_ptr *local_758;
  Proxy_Function local_750;
  allocator<char> local_739;
  string local_738;
  offset_in_TestBaseType_to_function<int_(int)> local_718;
  Proxy_Function local_710;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  offset_in_TestBaseType_to_unknown local_660;
  Proxy_Function local_658;
  allocator<char> local_641;
  string local_640;
  code *local_620;
  undefined8 local_618;
  Proxy_Function local_610;
  allocator<char> local_5f9;
  string local_5f8;
  code *local_5d8;
  undefined8 local_5d0;
  Proxy_Function local_5c8;
  allocator<char> local_5b1;
  string local_5b0;
  code *local_590;
  undefined8 local_588;
  Proxy_Function local_580;
  allocator<char> local_569;
  string local_568;
  offset_in_TestBaseType_to_unknown local_548;
  Proxy_Function local_540;
  allocator<char> local_529;
  string local_528;
  offset_in_TestBaseType_to_unknown local_508;
  Proxy_Function local_500;
  allocator<char> local_4e9;
  string local_4e8;
  offset_in_TestBaseType_to_int local_4c8;
  Proxy_Function local_4c0;
  allocator<char> local_4a9;
  string local_4a8;
  offset_in_TestBaseType_to_subr local_488 [2];
  Proxy_Function local_478;
  allocator<char> local_461;
  string local_460;
  offset_in_TestDerivedType_to_subr local_440 [2];
  Proxy_Function local_430;
  allocator<char> local_419;
  string local_418;
  _func_shared_ptr<TestBaseType> *local_3f8;
  Proxy_Function local_3f0;
  allocator<char> local_3d9;
  string local_3d8;
  _func_shared_ptr<TestBaseType> *local_3b8;
  Proxy_Function local_3b0;
  allocator<char> local_399;
  string local_398;
  _func_shared_ptr<TestBaseType> *local_378;
  Proxy_Function local_370;
  allocator<char> local_359;
  string local_358;
  code *local_338;
  undefined8 local_330;
  Proxy_Function local_328;
  Type_Conversion local_318;
  Type_Conversion local_308;
  Type_Conversion local_2f8;
  allocator<char> local_2e1;
  string local_2e0;
  Proxy_Function local_2c0;
  allocator<char> local_2a9;
  string local_2a8;
  Proxy_Function local_288;
  allocator<char> local_271;
  string local_270;
  Proxy_Function local_250;
  allocator<char> local_239;
  string local_238;
  Proxy_Function local_218;
  allocator<char> local_201;
  string local_200;
  Proxy_Function local_1e0;
  allocator<char> local_1c9;
  string local_1c8;
  Proxy_Function local_1a8;
  allocator<char> local_191;
  string local_190;
  Proxy_Function local_170;
  allocator<char> local_159;
  string local_158;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  allocator<char> local_119;
  string local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  allocator<char> local_d9;
  string local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  allocator<char> local_99;
  string local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  allocator<char> local_59;
  string local_58;
  Proxy_Function local_28;
  undefined1 local_11;
  ModulePtr *m;
  
  local_11 = 0;
  this = (Module *)operator_new(0x78);
  (this->m_conversions).
  super__Vector_base<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_conversions).
  super__Vector_base<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_evals).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_evals).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_globals).
  super__Vector_base<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_evals).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_globals).
  super__Vector_base<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_globals).
  super__Vector_base<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_funcs).
  super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_funcs).
  super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_typeinfos).
  super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_funcs).
  super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_typeinfos).
  super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_typeinfos).
  super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_conversions).
  super__Vector_base<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chaiscript::Module::Module(this);
  std::shared_ptr<chaiscript::Module>::shared_ptr<chaiscript::Module,void>
            ((shared_ptr<chaiscript::Module> *)in_RDI,this);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::fun<std::__cxx11::string(&)()>((chaiscript *)&local_28,hello_world_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"hello_world",&local_59);
  chaiscript::Module::add(peVar1,&local_28,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::user_type<TestBaseType>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"TestBaseType",&local_99);
  ti.m_bare_type_info = (type_info *)uStack_70;
  ti.m_type_info = (type_info *)local_78;
  ti._16_8_ = local_68;
  chaiscript::Module::add(peVar1,ti,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::user_type<TestDerivedType>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"TestDerivedType",&local_d9);
  ti_00.m_bare_type_info = (type_info *)uStack_b0;
  ti_00.m_type_info = (type_info *)local_b8;
  ti_00._16_8_ = local_a8;
  chaiscript::Module::add(peVar1,ti_00,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::user_type<TestMoreDerivedType>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"TestMoreDerivedType",&local_119);
  ti_01.m_bare_type_info = (type_info *)uStack_f0;
  ti_01.m_type_info = (type_info *)local_f8;
  ti_01._16_8_ = local_e8;
  chaiscript::Module::add(peVar1,ti_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::user_type<Type2>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"Type2",&local_159);
  ti_02.m_bare_type_info = (type_info *)uStack_130;
  ti_02.m_type_info = (type_info *)local_138;
  ti_02._16_8_ = local_128;
  chaiscript::Module::add(peVar1,ti_02,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<TestBaseType()>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"TestBaseType",&local_191)
  ;
  chaiscript::Module::add(peVar1,&local_170,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_170);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<TestBaseType(TestBaseType_const&)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"TestBaseType",&local_1c9)
  ;
  chaiscript::Module::add(peVar1,&local_1a8,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1a8);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<TestBaseType(int*)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"TestBaseType",&local_201)
  ;
  chaiscript::Module::add(peVar1,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_1e0);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<TestDerivedType()>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"TestDerivedType",&local_239);
  chaiscript::Module::add(peVar1,&local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_218);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<TestDerivedType(TestDerivedType_const&)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"TestDerivedType",&local_271);
  chaiscript::Module::add(peVar1,&local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_250);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<TestMoreDerivedType()>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"TestMoreDerivedType",&local_2a9);
  chaiscript::Module::add(peVar1,&local_288,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_288);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<TestMoreDerivedType(TestMoreDerivedType_const&)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"TestMoreDerivedType",&local_2e1);
  chaiscript::Module::add(peVar1,&local_2c0,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_2c0);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::base_class<TestBaseType,TestDerivedType>();
  chaiscript::Module::add(peVar1,&local_2f8);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_2f8);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::base_class<TestBaseType,TestMoreDerivedType>();
  chaiscript::Module::add(peVar1,&local_308);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_308);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::base_class<TestDerivedType,TestMoreDerivedType>();
  chaiscript::Module::add(peVar1,&local_318);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_318);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_338 = TestDerivedType::derived_only_func;
  local_330 = 0;
  chaiscript::fun<int(TestDerivedType::*)()>
            ((chaiscript *)&local_328,(offset_in_TestDerivedType_to_subr *)&local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"derived_only_func",&local_359);
  chaiscript::Module::add(peVar1,&local_328,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_328);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_378 = derived_type_factory;
  chaiscript::fun<std::shared_ptr<TestBaseType>(*)()>((chaiscript *)&local_370,&local_378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_398,"derived_type_factory",&local_399);
  chaiscript::Module::add(peVar1,&local_370,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_370);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_3b8 = more_derived_type_factory;
  chaiscript::fun<std::shared_ptr<TestBaseType>(*)()>((chaiscript *)&local_3b0,&local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"more_derived_type_factory",&local_3d9);
  chaiscript::Module::add(peVar1,&local_3b0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_3b0);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_3f8 = null_factory;
  chaiscript::fun<std::shared_ptr<TestBaseType>(*)()>((chaiscript *)&local_3f0,&local_3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"null_factory",&local_419)
  ;
  chaiscript::Module::add(peVar1,&local_3f0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_3f0);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_440[1] = 0;
  local_440[0] = 0x11;
  chaiscript::fun<int(TestDerivedType::*)()>((chaiscript *)&local_430,local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_460,"func",&local_461);
  chaiscript::Module::add(peVar1,&local_430,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_430);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_488[1] = 0;
  local_488[0] = 0x11;
  chaiscript::fun<int(TestBaseType::*)()>((chaiscript *)&local_478,local_488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"func",&local_4a9);
  chaiscript::Module::add(peVar1,&local_478,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_478);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_4c8 = 8;
  chaiscript::fun<int_TestBaseType::*>((chaiscript *)&local_4c0,&local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"val",&local_4e9);
  chaiscript::Module::add(peVar1,&local_4c0,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_4c0);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_508 = 0xc;
  chaiscript::fun<int_const_TestBaseType::*>((chaiscript *)&local_500,&local_508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"const_val",&local_529);
  chaiscript::Module::add(peVar1,&local_500,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_500);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_548 = 0x10;
  chaiscript::fun<int_const*TestBaseType::*>((chaiscript *)&local_540,&local_548);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"const_val_ptr",&local_569);
  chaiscript::Module::add(peVar1,&local_540,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_540);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_590 = TestBaseType::get_const_val_ptr;
  local_588 = 0;
  chaiscript::fun<int_const*(TestBaseType::*)()>
            ((chaiscript *)&local_580,(offset_in_TestBaseType_to_subr *)&local_590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"get_const_val_ptr",&local_5b1);
  chaiscript::Module::add(peVar1,&local_580,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_580);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_5d8 = TestBaseType::base_only_func;
  local_5d0 = 0;
  chaiscript::fun<int(TestBaseType::*)()>
            ((chaiscript *)&local_5c8,(offset_in_TestBaseType_to_subr *)&local_5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"base_only_func",&local_5f9);
  chaiscript::Module::add(peVar1,&local_5c8,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_5c8);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_620 = TestBaseType::set_string_val;
  local_618 = 0;
  chaiscript::fun<void(TestBaseType::*)(std::__cxx11::string&)>
            ((chaiscript *)&local_610,(offset_in_TestBaseType_to_subr *)&local_620);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"set_string_val",&local_641);
  chaiscript::Module::add(peVar1,&local_610,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::allocator<char>::~allocator(&local_641);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_610);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_660 = 0x18;
  chaiscript::fun<int(TestBaseType::*)[2][3][5]>((chaiscript *)&local_658,&local_660);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"mdarray",&local_681);
  chaiscript::Module::add(peVar1,&local_658,&local_680);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_658);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"IntArray_2_3_5",&local_6a9);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  chaiscript::bootstrap::array<int[2][3][5],void>(&local_6a8,peVar1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"IntArray_3_5",&local_6d1)
  ;
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  chaiscript::bootstrap::array<int[3][5],void>(&local_6d0,peVar1);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"IntArray_5",&local_6f9);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_RDI);
  chaiscript::bootstrap::array<int[5],void>(&local_6f8,peVar1);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_718 = 0x90;
  chaiscript::fun<std::function<int(int)>TestBaseType::*>((chaiscript *)&local_710,&local_718);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"func_member",&local_739);
  chaiscript::Module::add(peVar1,&local_710,&local_738);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_710);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_758 = get_new_int;
  chaiscript::fun<int*(*)()>((chaiscript *)&local_750,&local_758);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"get_new_int",&local_779);
  chaiscript::Module::add(peVar1,&local_750,&local_778);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_750);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_794 = TestValue1;
  chaiscript::const_var<TestEnum>((chaiscript *)&local_790,&local_794);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"TestValue1",&local_7b9);
  chaiscript::Module::add_global_const(peVar1,&local_790,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  chaiscript::Boxed_Value::~Boxed_Value(&local_790);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::user_type<TestEnum>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f8,"TestEnum",&local_7f9);
  ti_03.m_bare_type_info = (type_info *)uStack_7d0;
  ti_03.m_type_info = (type_info *)local_7d8;
  ti_03._16_8_ = local_7c8;
  chaiscript::Module::add(peVar1,ti_03,&local_7f8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_818 = to_int;
  chaiscript::fun<int(*)(TestEnum)>((chaiscript *)&local_810,&local_818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"to_int",&local_839);
  chaiscript::Module::add(peVar1,&local_810,&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_810);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_860 = TestBaseType::constMe;
  local_858 = 0;
  chaiscript::fun<TestBaseType_const&(TestBaseType::*)()const>
            ((chaiscript *)&local_850,(offset_in_TestBaseType_to_subr *)&local_860);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_880,"constMe",&local_881);
  chaiscript::Module::add(peVar1,&local_850,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_850);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::type_conversion<TestBaseType,Type2,create_chaiscript_module_test_module::__0>
            ((chaiscript *)&local_898,&local_899);
  chaiscript::Module::add(peVar1,&local_898);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_898);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_8c0 = Type2::get_val;
  local_8b8 = 0;
  chaiscript::fun<int(Type2::*)()const>
            ((chaiscript *)&local_8b0,(offset_in_Type2_to_subr *)&local_8c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e0,"get_val",&local_8e1);
  chaiscript::Module::add(peVar1,&local_8b0,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator(&local_8e1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_8b0);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_908 = Type2::get_str;
  local_900 = 0;
  chaiscript::fun<char_const*(Type2::*)()const>
            ((chaiscript *)&local_8f8,(offset_in_Type2_to_subr *)&local_908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"get_str",&local_929);
  chaiscript::Module::add(peVar1,&local_8f8,&local_928);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_8f8);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::type_conversion<char_const*,std::__cxx11::string>();
  chaiscript::Module::add(peVar1,&local_940);
  std::shared_ptr<chaiscript::detail::Type_Conversion_Base>::~shared_ptr(&local_940);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  chaiscript::constructor<Type2(TestBaseType_const&)>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_970,"Type2",&local_971);
  chaiscript::Module::add(peVar1,&local_950,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator(&local_971);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_950);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_990 = update_shared_ptr;
  chaiscript::fun<void(*)(std::shared_ptr<TestBaseType>&)>((chaiscript *)&local_988,&local_990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"update_shared_ptr",&local_9b1);
  chaiscript::Module::add(peVar1,&local_988,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_988);
  peVar1 = std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RDI);
  local_9d0 = nullify_shared_ptr;
  chaiscript::fun<void(*)(std::shared_ptr<TestBaseType>&)>((chaiscript *)&local_9c8,&local_9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"nullify_shared_ptr",&local_9f1);
  chaiscript::Module::add(peVar1,&local_9c8,&local_9f0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_9c8);
  MVar2.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar2.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar2.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CHAISCRIPT_MODULE_EXPORT chaiscript::ModulePtr create_chaiscript_module_test_module() {
  chaiscript::ModulePtr m(new chaiscript::Module());

  m->add(chaiscript::fun(hello_world), "hello_world");

  m->add(chaiscript::user_type<TestBaseType>(), "TestBaseType");
  m->add(chaiscript::user_type<TestDerivedType>(), "TestDerivedType");
  m->add(chaiscript::user_type<TestMoreDerivedType>(), "TestMoreDerivedType");
  m->add(chaiscript::user_type<Type2>(), "Type2");

  m->add(chaiscript::constructor<TestBaseType()>(), "TestBaseType");
  //  m->add(chaiscript::constructor<TestBaseType (int)>(), "TestBaseType");
  m->add(chaiscript::constructor<TestBaseType(const TestBaseType &)>(), "TestBaseType");
  m->add(chaiscript::constructor<TestBaseType(int *)>(), "TestBaseType");

  m->add(chaiscript::constructor<TestDerivedType()>(), "TestDerivedType");
  m->add(chaiscript::constructor<TestDerivedType(const TestDerivedType &)>(), "TestDerivedType");

  m->add(chaiscript::constructor<TestMoreDerivedType()>(), "TestMoreDerivedType");
  m->add(chaiscript::constructor<TestMoreDerivedType(const TestMoreDerivedType &)>(), "TestMoreDerivedType");

  /// \todo automatic chaining of base classes?
  m->add(chaiscript::base_class<TestBaseType, TestDerivedType>());
  m->add(chaiscript::base_class<TestBaseType, TestMoreDerivedType>());
  m->add(chaiscript::base_class<TestDerivedType, TestMoreDerivedType>());

  m->add(chaiscript::fun(&TestDerivedType::derived_only_func), "derived_only_func");

  m->add(chaiscript::fun(&derived_type_factory), "derived_type_factory");
  m->add(chaiscript::fun(&more_derived_type_factory), "more_derived_type_factory");
  m->add(chaiscript::fun(&null_factory), "null_factory");

  m->add(chaiscript::fun(&TestDerivedType::func), "func");

  m->add(chaiscript::fun(&TestBaseType::func), "func");
  m->add(chaiscript::fun(&TestBaseType::val), "val");
  m->add(chaiscript::fun(&TestBaseType::const_val), "const_val");
  m->add(chaiscript::fun(&TestBaseType::const_val_ptr), "const_val_ptr");
  m->add(chaiscript::fun(&TestBaseType::get_const_val_ptr), "get_const_val_ptr");
  m->add(chaiscript::fun(&TestBaseType::base_only_func), "base_only_func");
  m->add(chaiscript::fun(&TestBaseType::set_string_val), "set_string_val");

  m->add(chaiscript::fun(&TestBaseType::mdarray), "mdarray");
  chaiscript::bootstrap::array<int[2][3][5]>("IntArray_2_3_5", *m);
  chaiscript::bootstrap::array<int[3][5]>("IntArray_3_5", *m);
  chaiscript::bootstrap::array<int[5]>("IntArray_5", *m);

  // member that is a function
  m->add(chaiscript::fun(&TestBaseType::func_member), "func_member");
  m->add(chaiscript::fun(&get_new_int), "get_new_int");

  m->add_global_const(chaiscript::const_var(TestValue1), "TestValue1");

  m->add(chaiscript::user_type<TestEnum>(), "TestEnum");

  m->add(chaiscript::fun(&to_int), "to_int");
  m->add(chaiscript::fun(&TestBaseType::constMe), "constMe");

  m->add(chaiscript::type_conversion<TestBaseType, Type2>([](const TestBaseType &t_bt) { return Type2(t_bt); }));

  m->add(chaiscript::fun(&Type2::get_val), "get_val");
  m->add(chaiscript::fun(&Type2::get_str), "get_str");
  m->add(chaiscript::type_conversion<const char *, std::string>());
  m->add(chaiscript::constructor<Type2(const TestBaseType &)>(), "Type2");

  m->add(chaiscript::fun(&update_shared_ptr), "update_shared_ptr");
  m->add(chaiscript::fun(&nullify_shared_ptr), "nullify_shared_ptr");

  return m;
}